

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteGml.c
# Opt level: O2

void Io_WriteGml(Abc_Ntk_t *pNtk,char *pFileName)

{
  uint uVar1;
  FILE *__stream;
  char *pcVar2;
  Abc_Obj_t *pAVar3;
  char *pcVar4;
  int iVar5;
  long lVar6;
  
  if ((pNtk->ntkType & ~ABC_NTK_NETLIST) != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsStrash(pNtk) || Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteGml.c"
                  ,0x34,"void Io_WriteGml(Abc_Ntk_t *, char *)");
  }
  __stream = fopen(pFileName,"w");
  if (__stream != (FILE *)0x0) {
    pcVar4 = pNtk->pName;
    pcVar2 = Extra_TimeStamp();
    fprintf(__stream,"# GML for \"%s\" written by ABC on %s\n",pcVar4,pcVar2);
    fwrite("graph [\n",8,1,__stream);
    fputc(10,__stream);
    for (iVar5 = 0; iVar5 < pNtk->vPos->nSize; iVar5 = iVar5 + 1) {
      pAVar3 = (Abc_Obj_t *)Vec_PtrEntry(pNtk->vPos,iVar5);
      uVar1 = pAVar3->Id;
      pcVar4 = Abc_ObjName(pAVar3);
      fprintf(__stream,"    node [ id %5d label \"%s\"\n",(ulong)uVar1,pcVar4);
      fwrite("        graphics [ type \"triangle\" fill \"#00FFFF\" ]\n",0x34,1,__stream);
      fwrite("    ]\n",6,1,__stream);
    }
    fputc(10,__stream);
    iVar5 = 0;
    while( true ) {
      if (pNtk->vPis->nSize <= iVar5) break;
      pAVar3 = (Abc_Obj_t *)Vec_PtrEntry(pNtk->vPis,iVar5);
      uVar1 = pAVar3->Id;
      pcVar4 = Abc_ObjName(pAVar3);
      fprintf(__stream,"    node [ id %5d label \"%s\"\n",(ulong)uVar1,pcVar4);
      fwrite("        graphics [ type \"triangle\" fill \"#00FF00\" ]\n",0x34,1,__stream);
      fwrite("    ]\n",6,1,__stream);
      iVar5 = iVar5 + 1;
    }
    fputc(10,__stream);
    for (iVar5 = 0; iVar5 < pNtk->vBoxes->nSize; iVar5 = iVar5 + 1) {
      pAVar3 = (Abc_Obj_t *)Vec_PtrEntry(pNtk->vBoxes,iVar5);
      if ((*(uint *)&pAVar3->field_0x14 & 0xf) == 8) {
        uVar1 = pAVar3->Id;
        pcVar4 = Abc_ObjName(pAVar3);
        fprintf(__stream,"    node [ id %5d label \"%s\"\n",(ulong)uVar1,pcVar4);
        fwrite("        graphics [ type \"rectangle\" fill \"#FF0000\" ]\n",0x35,1,__stream);
        fwrite("    ]\n",6,1,__stream);
      }
    }
    fputc(10,__stream);
    for (iVar5 = 0; iVar5 < pNtk->vObjs->nSize; iVar5 = iVar5 + 1) {
      pAVar3 = Abc_NtkObj(pNtk,iVar5);
      if ((pAVar3 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar3->field_0x14 & 0xf) == 7)) {
        uVar1 = pAVar3->Id;
        pcVar4 = Abc_ObjName(pAVar3);
        fprintf(__stream,"    node [ id %5d label \"%s\"\n",(ulong)uVar1,pcVar4);
        fwrite("        graphics [ type \"ellipse\" fill \"#CCCCFF\" ]\n",0x33,1,__stream);
        fwrite("    ]\n",6,1,__stream);
      }
    }
    fputc(10,__stream);
    for (iVar5 = 0; iVar5 < pNtk->vObjs->nSize; iVar5 = iVar5 + 1) {
      pAVar3 = Abc_NtkObj(pNtk,iVar5);
      if (pAVar3 != (Abc_Obj_t *)0x0) {
        for (lVar6 = 0; lVar6 < (pAVar3->vFanins).nSize; lVar6 = lVar6 + 1) {
          fprintf(__stream,"    edge [ source %5d   target %5d\n",(ulong)(uint)pAVar3->Id,
                  (ulong)*(uint *)((long)pAVar3->pNtk->vObjs->pArray
                                         [(pAVar3->vFanins).pArray[lVar6]] + 0x10));
          fwrite("        graphics [ type \"line\" arrow \"first\" ]\n",0x2f,1,__stream);
          fwrite("    ]\n",6,1,__stream);
        }
      }
    }
    fwrite("]\n",2,1,__stream);
    fputc(10,__stream);
    fclose(__stream);
    return;
  }
  fprintf(_stdout,"Io_WriteGml(): Cannot open the output file \"%s\".\n",pFileName);
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Writes the graph structure of AIG in GML.]

  Description [Useful for graph visualization using tools such as yEd: 
  http://www.yworks.com/]
  
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Io_WriteGml( Abc_Ntk_t * pNtk, char * pFileName )
{
    FILE * pFile;
    Abc_Obj_t * pObj, * pFanin;
    int i, k;

    assert( Abc_NtkIsStrash(pNtk) || Abc_NtkIsLogic(pNtk)  );

    // start the output stream
    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Io_WriteGml(): Cannot open the output file \"%s\".\n", pFileName );
        return;
    }
    fprintf( pFile, "# GML for \"%s\" written by ABC on %s\n", pNtk->pName, Extra_TimeStamp() );
    fprintf( pFile, "graph [\n" );

    // output the POs
    fprintf( pFile, "\n" );
    Abc_NtkForEachPo( pNtk, pObj, i )
    {
        fprintf( pFile, "    node [ id %5d label \"%s\"\n", pObj->Id, Abc_ObjName(pObj) );
        fprintf( pFile, "        graphics [ type \"triangle\" fill \"#00FFFF\" ]\n" );   // blue
        fprintf( pFile, "    ]\n" );
    }
    // output the PIs
    fprintf( pFile, "\n" );
    Abc_NtkForEachPi( pNtk, pObj, i )
    {
        fprintf( pFile, "    node [ id %5d label \"%s\"\n", pObj->Id, Abc_ObjName(pObj) );
        fprintf( pFile, "        graphics [ type \"triangle\" fill \"#00FF00\" ]\n" );   // green
        fprintf( pFile, "    ]\n" );
    }
    // output the latches
    fprintf( pFile, "\n" );
    Abc_NtkForEachLatch( pNtk, pObj, i )
    {
        fprintf( pFile, "    node [ id %5d label \"%s\"\n", pObj->Id, Abc_ObjName(pObj) );
        fprintf( pFile, "        graphics [ type \"rectangle\" fill \"#FF0000\" ]\n" );   // red
        fprintf( pFile, "    ]\n" );
    }
    // output the nodes
    fprintf( pFile, "\n" );
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        fprintf( pFile, "    node [ id %5d label \"%s\"\n", pObj->Id, Abc_ObjName(pObj) );
        fprintf( pFile, "        graphics [ type \"ellipse\" fill \"#CCCCFF\" ]\n" );     // grey
        fprintf( pFile, "    ]\n" );
    }

    // output the edges
    fprintf( pFile, "\n" );
    Abc_NtkForEachObj( pNtk, pObj, i )
    {
        Abc_ObjForEachFanin( pObj, pFanin, k )
        {
            fprintf( pFile, "    edge [ source %5d   target %5d\n", pObj->Id, pFanin->Id );
            fprintf( pFile, "        graphics [ type \"line\" arrow \"first\" ]\n" );
            fprintf( pFile, "    ]\n" );
        }
    }

    fprintf( pFile, "]\n" );
    fprintf( pFile, "\n" );
    fclose( pFile );
}